

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int maybechunked)

{
  char *first;
  int iVar1;
  contenc_writer *pcVar2;
  bool bVar3;
  contenc_writer *writer;
  content_encoding *encoding;
  size_t namelen;
  char *name;
  int counter;
  SingleRequest *k;
  char *pcStack_20;
  int maybechunked_local;
  char *enclist_local;
  Curl_easy *data_local;
  
  name._4_4_ = 0;
  pcStack_20 = enclist;
  do {
    while( true ) {
      first = pcStack_20;
      bVar3 = true;
      if ((*pcStack_20 != ' ') && (bVar3 = true, *pcStack_20 != '\t')) {
        bVar3 = *pcStack_20 == ',';
      }
      if (!bVar3) break;
      pcStack_20 = pcStack_20 + 1;
    }
    encoding = (content_encoding *)0x0;
    while( true ) {
      bVar3 = false;
      if (*pcStack_20 != '\0') {
        bVar3 = *pcStack_20 != ',';
      }
      if (!bVar3) break;
      if (((*pcStack_20 != ' ') && (*pcStack_20 != '\t')) &&
         ((*pcStack_20 < '\n' || ('\r' < *pcStack_20)))) {
        encoding = (content_encoding *)(pcStack_20 + (1 - (long)first));
      }
      pcStack_20 = pcStack_20 + 1;
    }
    if (((maybechunked == 0) || (encoding != (content_encoding *)0x7)) ||
       (iVar1 = Curl_strncasecompare(first,"chunked",7), iVar1 == 0)) {
      if (encoding != (content_encoding *)0x0) {
        writer = (contenc_writer *)find_encoding(first,(size_t)encoding);
        if ((data->req).writer_stack == (contenc_writer *)0x0) {
          pcVar2 = new_unencoding_writer(data,&client_encoding,(contenc_writer *)0x0);
          (data->req).writer_stack = pcVar2;
          if ((data->req).writer_stack == (contenc_writer *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if ((content_encoding *)writer == (content_encoding *)0x0) {
          writer = (contenc_writer *)&error_encoding;
        }
        name._4_4_ = name._4_4_ + 1;
        if (4 < (int)name._4_4_) {
          Curl_failf(data,"Reject response due to %u content encodings",(ulong)name._4_4_);
          return CURLE_BAD_CONTENT_ENCODING;
        }
        pcVar2 = new_unencoding_writer(data,(content_encoding *)writer,(data->req).writer_stack);
        if (pcVar2 == (contenc_writer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (data->req).writer_stack = pcVar2;
      }
    }
    else {
      *(ushort *)&(data->req).field_0xd9 = *(ushort *)&(data->req).field_0xd9 & 0xffdf | 0x20;
      Curl_httpchunk_init(data);
    }
    if (*pcStack_20 == '\0') {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int maybechunked)
{
  struct SingleRequest *k = &data->req;
  int counter = 0;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(data);   /* init our chunky engine. */
    }
    else if(namelen) {
      const struct content_encoding *encoding = find_encoding(name, namelen);
      struct contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(data, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      if(++counter >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to %u content encodings",
              counter);
        return CURLE_BAD_CONTENT_ENCODING;
      }
      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(data, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}